

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O3

AV1Decoder * av1_decoder_create(BufferPool *pool)

{
  int iVar1;
  AV1Decoder *pbi_00;
  FRAME_CONTEXT *pFVar2;
  AVxWorkerInterface *pAVar3;
  long lVar4;
  AV1_COMMON *cm;
  AV1Decoder *pbi;
  
  pbi_00 = (AV1Decoder *)aom_memalign(0x20,0x600c0);
  if (pbi_00 != (AV1Decoder *)0x0) {
    memset(pbi_00,0,0x600c0);
    (pbi_00->common).seq_params = &pbi_00->seq_params;
    (pbi_00->common).error = &pbi_00->error;
    iVar1 = _setjmp((__jmp_buf_tag *)(pbi_00->error).jmp);
    if (iVar1 == 0) {
      (pbi_00->error).setjmp = 1;
      pFVar2 = (FRAME_CONTEXT *)aom_memalign(0x20,0x52fc);
      (pbi_00->common).fc = pFVar2;
      if ((pbi_00->common).fc == (FRAME_CONTEXT *)0x0) {
        aom_internal_error((pbi_00->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate cm->fc");
      }
      pFVar2 = (FRAME_CONTEXT *)aom_memalign(0x20,0x52fc);
      (pbi_00->common).default_frame_context = pFVar2;
      if ((pbi_00->common).default_frame_context == (FRAME_CONTEXT *)0x0) {
        aom_internal_error((pbi_00->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate cm->default_frame_context");
      }
      memset((pbi_00->common).fc,0,0x52fc);
      memset((pbi_00->common).default_frame_context,0,0x52fc);
      pbi_00->need_resync = 1;
      av1_rtcd();
      aom_dsp_rtcd();
      aom_scale_rtcd();
      av1_init_intra_predictors();
      av1_init_wedge_masks();
      lVar4 = 0;
      do {
        (pbi_00->common).ref_frame_map[lVar4] = (RefCntBuffer *)0x0;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      (pbi_00->common).current_frame.frame_number = 0;
      pbi_00->decoding_first_frame = 1;
      (pbi_00->common).buffer_pool = pool;
      ((pbi_00->common).seq_params)->bit_depth = AOM_BITS_8;
      (pbi_00->common).mi_params.free_mi = dec_free_mi;
      (pbi_00->common).mi_params.setup_mi = dec_setup_mi;
      (pbi_00->common).mi_params.set_mb_mi = dec_set_mb_mi;
      av1_loop_filter_init(&pbi_00->common);
      av1_qm_init(&(pbi_00->common).quant_params,
                  (uint)(((pbi_00->common).seq_params)->monochrome == '\0') * 2 + 1);
      av1_loop_restoration_precal();
      (pbi_00->error).setjmp = 0;
      pAVar3 = aom_get_worker_interface();
      (*pAVar3->init)(&pbi_00->lf_worker);
      (pbi_00->lf_worker).thread_name = "aom lf worker";
      return pbi_00;
    }
    (pbi_00->error).setjmp = 0;
    av1_decoder_remove(pbi_00);
  }
  return (AV1Decoder *)0x0;
}

Assistant:

AV1Decoder *av1_decoder_create(BufferPool *const pool) {
  AV1Decoder *volatile const pbi = aom_memalign(32, sizeof(*pbi));
  if (!pbi) return NULL;
  av1_zero(*pbi);

  AV1_COMMON *volatile const cm = &pbi->common;
  cm->seq_params = &pbi->seq_params;
  cm->error = &pbi->error;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(pbi->error.jmp)) {
    pbi->error.setjmp = 0;
    av1_decoder_remove(pbi);
    return NULL;
  }

  pbi->error.setjmp = 1;

  CHECK_MEM_ERROR(cm, cm->fc,
                  (FRAME_CONTEXT *)aom_memalign(32, sizeof(*cm->fc)));
  CHECK_MEM_ERROR(
      cm, cm->default_frame_context,
      (FRAME_CONTEXT *)aom_memalign(32, sizeof(*cm->default_frame_context)));
  memset(cm->fc, 0, sizeof(*cm->fc));
  memset(cm->default_frame_context, 0, sizeof(*cm->default_frame_context));

  pbi->need_resync = 1;
  initialize_dec();

  // Initialize the references to not point to any frame buffers.
  for (int i = 0; i < REF_FRAMES; i++) {
    cm->ref_frame_map[i] = NULL;
  }

  cm->current_frame.frame_number = 0;
  pbi->decoding_first_frame = 1;
  pbi->common.buffer_pool = pool;

  cm->seq_params->bit_depth = AOM_BITS_8;

  cm->mi_params.free_mi = dec_free_mi;
  cm->mi_params.setup_mi = dec_setup_mi;
  cm->mi_params.set_mb_mi = dec_set_mb_mi;

  av1_loop_filter_init(cm);

  av1_qm_init(&cm->quant_params, av1_num_planes(cm));
  av1_loop_restoration_precal();

#if CONFIG_ACCOUNTING
  pbi->acct_enabled = 1;
  aom_accounting_init(&pbi->accounting);
#endif

  pbi->error.setjmp = 0;

  aom_get_worker_interface()->init(&pbi->lf_worker);
  pbi->lf_worker.thread_name = "aom lf worker";

  return pbi;
}